

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

int __thiscall cmCPackIFWGenerator::PackageFiles(cmCPackIFWGenerator *this)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  cmCPackLog *pcVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  size_t sVar8;
  char *pcVar9;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  size_type *psVar14;
  uint uVar15;
  iterator it_1;
  pointer pbVar16;
  iterator it;
  bool bVar17;
  string ifwCmd;
  int retVal;
  string ifwTmpFile;
  string output;
  ostringstream cmCPackLog_msg;
  ostringstream cmCPackLog_msg_3;
  string ifwTLD;
  long *local_4a0;
  long local_498;
  long local_490 [2];
  int local_47c;
  long *local_478;
  long local_470;
  long local_468 [2];
  string local_458;
  long *local_438;
  long local_428 [2];
  undefined1 local_418 [112];
  ios_base local_3a8 [472];
  undefined1 local_1d0 [112];
  ios_base local_160 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,"- Configuration",0xf);
  std::ios::widen((char)(ostringstream *)local_418 + (char)*(undefined8 *)(local_418._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_418);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar6 = local_1d0._0_8_;
  sVar8 = strlen((char *)local_1d0._0_8_);
  cmCPackLog::Log(pcVar3,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0x45,(char *)uVar6,sVar8);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
  std::ios_base::~ios_base(local_3a8);
  cmCPackIFWInstaller::GenerateInstallerFile(&this->Installer);
  cmCPackIFWInstaller::GeneratePackageFiles(&this->Installer);
  local_418._0_8_ = local_418 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"CPACK_TOPLEVEL_DIRECTORY","")
  ;
  pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_418);
  std::__cxx11::string::string((string *)&local_50,pcVar9,(allocator *)local_1d0);
  if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char*>((string *)&local_478,local_50,local_48 + (long)local_50)
  ;
  std::__cxx11::string::append((char *)&local_478);
  if ((this->Installer).Repositories.
      super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Installer).Repositories.
      super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4a0 = local_490;
    pcVar4 = (this->RepoGen)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar4,pcVar4 + (this->RepoGen)._M_string_length);
    bVar7 = cmSystemTools::VersionCompare(OP_LESS,(this->FrameworkVersion)._M_dataplus._M_p,"2.0.0")
    ;
    if (bVar7) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     " -c ",&(this->super_cmCPackGenerator).toplevel);
      plVar10 = (long *)std::__cxx11::string::append(local_1d0);
      local_418._0_8_ = local_418 + 0x10;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar14) {
        local_418._16_8_ = *psVar14;
        local_418._24_8_ = plVar10[3];
      }
      else {
        local_418._16_8_ = *psVar14;
        local_418._0_8_ = (size_type *)*plVar10;
      }
      local_418._8_8_ = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
      if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
        operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
      }
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
    }
    psVar1 = &(this->super_cmCPackGenerator).toplevel;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   " -p ",psVar1);
    plVar10 = (long *)std::__cxx11::string::append(local_1d0);
    local_418._0_8_ = local_418 + 0x10;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      local_418._16_8_ = *psVar14;
      local_418._24_8_ = plVar10[3];
    }
    else {
      local_418._16_8_ = *psVar14;
      local_418._0_8_ = (size_type *)*plVar10;
    }
    local_418._8_8_ = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
    if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
      operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
    }
    local_58 = psVar1;
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    pbVar16 = (this->PkgsDirsVector).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar16 !=
        (this->PkgsDirsVector).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_418," -p ",pbVar16);
        std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
        if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
        }
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 !=
               (this->PkgsDirsVector).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((this->OnlineOnly == false) &&
       ((this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__cxx11::string::append((char *)&local_4a0);
      p_Var11 = (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_append((char *)&local_4a0,*(ulong *)(*(long *)(p_Var11 + 1) + 0x80));
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      p_Var2 = &(this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var2) {
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_418,",",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(p_Var11 + 1) + 0x80));
          std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
          if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
            operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var2);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   " ",local_58);
    plVar10 = (long *)std::__cxx11::string::append(local_1d0);
    local_418._0_8_ = local_418 + 0x10;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      local_418._16_8_ = *psVar14;
      local_418._24_8_ = plVar10[3];
    }
    else {
      local_418._16_8_ = *psVar14;
      local_418._0_8_ = (size_type *)*plVar10;
    }
    local_418._8_8_ = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
    if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
      operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
    }
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,"Execute: ",9);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_418,(char *)local_4a0,local_498);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar6 = local_1d0._0_8_;
    sVar8 = strlen((char *)local_1d0._0_8_);
    cmCPackLog::Log(pcVar3,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x75,(char *)uVar6,sVar8);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    std::ios_base::~ios_base(local_3a8);
    local_458._M_string_length = 0;
    local_458.field_2._M_local_buf[0] = '\0';
    local_47c = 1;
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_418,"- Generate repository",0x15);
    std::ios::widen((char)(ostream *)local_418 + (char)*(undefined8 *)(local_418._0_8_ + -0x18));
    std::ostream::put((char)local_418);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar6 = local_1d0._0_8_;
    sVar8 = strlen((char *)local_1d0._0_8_);
    cmCPackLog::Log(pcVar3,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x79,(char *)uVar6,sVar8);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    std::ios_base::~ios_base(local_3a8);
    bVar7 = cmSystemTools::RunSingleCommand
                      ((char *)local_4a0,&local_458,&local_458,&local_47c,(char *)0x0,
                       (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
    bVar17 = local_47c != 0;
    if (!bVar7 || bVar17) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_418,(char *)local_478,false);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,"# Run command: ",0xf)
      ;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_418,(char *)local_4a0,local_498);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"# Output:",9);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      poVar12 = (ostream *)std::ostream::flush();
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_458._M_dataplus._M_p,local_458._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,"Problem running IFW command: ",0x1d);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d0,(char *)local_4a0,local_498);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Please check ",0xd);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_478,local_470);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," for errors",0xb);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar10 = local_438;
      sVar8 = strlen((char *)local_438);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x86,(char *)plVar10,sVar8);
      if (local_438 != local_428) {
        operator_delete(local_438,local_428[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::ios_base::~ios_base(local_160);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_418);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,"- repository: ",0xe);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_418,
                           (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                           (this->super_cmCPackGenerator).toplevel._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/repository generated",0x15);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      uVar6 = local_1d0._0_8_;
      sVar8 = strlen((char *)local_1d0._0_8_);
      cmCPackLog::Log(pcVar3,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x8a,(char *)uVar6,sVar8);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
      std::ios_base::~ios_base(local_3a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,
                      CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                               local_458.field_2._M_local_buf[0]) + 1);
    }
    if (local_4a0 != local_490) {
      operator_delete(local_4a0,local_490[0] + 1);
    }
    uVar15 = 0;
    if (!bVar7 || bVar17) goto LAB_0024cd8b;
  }
  local_4a0 = local_490;
  pcVar4 = (this->BinCreator)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,pcVar4,pcVar4 + (this->BinCreator)._M_string_length);
  psVar1 = &(this->super_cmCPackGenerator).toplevel;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 " -c ",psVar1);
  plVar10 = (long *)std::__cxx11::string::append(local_1d0);
  local_418._0_8_ = local_418 + 0x10;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_418._16_8_ = *psVar14;
    local_418._24_8_ = plVar10[3];
  }
  else {
    local_418._16_8_ = *psVar14;
    local_418._0_8_ = (size_type *)*plVar10;
  }
  local_418._8_8_ = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
  if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 " -p ",psVar1);
  plVar10 = (long *)std::__cxx11::string::append(local_1d0);
  local_418._0_8_ = local_418 + 0x10;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_418._16_8_ = *psVar14;
    local_418._24_8_ = plVar10[3];
  }
  else {
    local_418._16_8_ = *psVar14;
    local_418._0_8_ = (size_type *)*plVar10;
  }
  local_418._8_8_ = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
  if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  pbVar16 = (this->PkgsDirsVector).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar16 !=
      (this->PkgsDirsVector).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                     " -p ",pbVar16);
      std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
      if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
        operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 !=
             (this->PkgsDirsVector).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (this->OnlineOnly == true) {
    std::__cxx11::string::append((char *)&local_4a0);
  }
  else if (((this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
          ((this->Installer).Repositories.
           super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->Installer).Repositories.
           super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::string::append((char *)&local_4a0);
      p_Var13 = (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var13 != p_Var2) {
        do {
          local_418._0_8_ = local_418 + 0x10;
          lVar5 = *(long *)(*(long *)(p_Var13 + 1) + 0x80);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_418,lVar5,*(long *)(*(long *)(p_Var13 + 1) + 0x88) + lVar5);
          std::__cxx11::string::append((char *)local_418);
          std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
          if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
            operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
          }
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        } while ((_Rb_tree_header *)p_Var13 != p_Var2);
      }
      p_Var11 = (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_append((char *)&local_4a0,*(ulong *)(p_Var11 + 2));
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      p_Var2 = &(this->DependentPackages)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var2) {
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_418,",",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var11 + 2));
          std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
          if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
            operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var2);
      }
    }
  }
  else {
    std::__cxx11::string::append((char *)&local_4a0);
    p_Var11 = (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_append((char *)&local_4a0,*(ulong *)(*(long *)(p_Var11 + 1) + 0x80));
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    p_Var2 = &(this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var2) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_418,",",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var11 + 1) + 0x80));
        std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
        if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var2);
    }
  }
  __rhs = (this->super_cmCPackGenerator).packageFileNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == __rhs) {
    std::__cxx11::string::append((char *)&local_4a0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   " ",__rhs);
    std::__cxx11::string::_M_append((char *)&local_4a0,local_418._0_8_);
    if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
      operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,"Execute: ",9);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_418,(char *)local_4a0,local_498);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar6 = local_1d0._0_8_;
  sVar8 = strlen((char *)local_1d0._0_8_);
  cmCPackLog::Log(pcVar3,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0xcb,(char *)uVar6,sVar8);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
  std::ios_base::~ios_base(local_3a8);
  local_458._M_string_length = 0;
  local_458.field_2._M_local_buf[0] = '\0';
  local_47c = 1;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,"- Generate package",0x12)
  ;
  std::ios::widen((char)(ostream *)local_418 + (char)*(undefined8 *)(local_418._0_8_ + -0x18));
  std::ostream::put((char)local_418);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar6 = local_1d0._0_8_;
  sVar8 = strlen((char *)local_1d0._0_8_);
  cmCPackLog::Log(pcVar3,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0xce,(char *)uVar6,sVar8);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
  std::ios_base::~ios_base(local_3a8);
  bVar7 = cmSystemTools::RunSingleCommand
                    ((char *)local_4a0,&local_458,&local_458,&local_47c,(char *)0x0,
                     (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
  bVar17 = local_47c == 0;
  if (!bVar7 || !bVar17) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_418,(char *)local_478,false);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,"# Run command: ",0xf);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_418,(char *)local_4a0,local_498);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"# Output:",9);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    poVar12 = (ostream *)std::ostream::flush();
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,local_458._M_dataplus._M_p,local_458._M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,"Problem running IFW command: ",0x1d);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,(char *)local_4a0,local_498);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Please check ",0xd);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(char *)local_478,local_470);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," for errors",0xb);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    plVar10 = local_438;
    sVar8 = strlen((char *)local_438);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0xdb,(char *)plVar10,sVar8);
    if (local_438 != local_428) {
      operator_delete(local_438,local_428[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_418);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,
                    CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                             local_458.field_2._M_local_buf[0]) + 1);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0,local_490[0] + 1);
  }
  uVar15 = (uint)(bVar7 && bVar17);
LAB_0024cd8b:
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return uVar15;
}

Assistant:

int cmCPackIFWGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- Configuration" << std::endl);

  // Installer configuragion
  Installer.GenerateInstallerFile();

  // Packages configuration
  Installer.GeneratePackageFiles();

  std::string ifwTLD = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string ifwTmpFile = ifwTLD;
  ifwTmpFile += "/IFWOutput.log";

  // Run repogen
  if (!Installer.Repositories.empty())
    {
    std::string ifwCmd = RepoGen;

    if(IsVersionLess("2.0.0"))
      {
      ifwCmd += " -c " + this->toplevel + "/config/config.xml";
      }

    ifwCmd += " -p " + this->toplevel + "/packages";

    if(!PkgsDirsVector.empty())
      {
      for(std::vector<std::string>::iterator it = PkgsDirsVector.begin();
          it != PkgsDirsVector.end(); ++it)
        {
        ifwCmd += " -p " + *it;
        }
      }

    if (!OnlineOnly && !DownloadedPackages.empty())
      {
      ifwCmd += " -i ";
      std::set<cmCPackIFWPackage*>::iterator it
        = DownloadedPackages.begin();
      ifwCmd += (*it)->Name;
      ++it;
      while(it != DownloadedPackages.end())
        {
        ifwCmd += "," + (*it)->Name;
        ++it;
        }
      }
    ifwCmd += " " + this->toplevel + "/repository";
    cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ifwCmd
                  << std::endl);
    std::string output;
    int retVal = 1;
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Generate repository" << std::endl);
    bool res = cmSystemTools::RunSingleCommand(
      ifwCmd.c_str(), &output, &output,
      &retVal, 0, this->GeneratorVerbose, 0);
    if ( !res || retVal )
      {
      cmGeneratedFileStream ofs(ifwTmpFile.c_str());
      ofs << "# Run command: " << ifwCmd << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
      cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running IFW command: "
                    << ifwCmd << std::endl
                    << "Please check " << ifwTmpFile << " for errors"
                    << std::endl);
      return 0;
      }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- repository: " << this->toplevel
                  << "/repository generated" << std::endl);
    }

  // Run binary creator
  {
  std::string ifwCmd = BinCreator;
  ifwCmd += " -c " + this->toplevel + "/config/config.xml";
  ifwCmd += " -p " + this->toplevel + "/packages";

  if(!PkgsDirsVector.empty())
    {
    for(std::vector<std::string>::iterator it = PkgsDirsVector.begin();
        it != PkgsDirsVector.end(); ++it)
      {
      ifwCmd += " -p " + *it;
      }
    }

  if (OnlineOnly)
    {
    ifwCmd += " --online-only";
    }
  else if (!DownloadedPackages.empty() && !Installer.Repositories.empty())
    {
    ifwCmd += " -e ";
    std::set<cmCPackIFWPackage*>::iterator it
      = DownloadedPackages.begin();
    ifwCmd += (*it)->Name;
    ++it;
    while(it != DownloadedPackages.end())
      {
      ifwCmd += "," + (*it)->Name;
      ++it;
      }
    }
  else if (!DependentPackages.empty())
    {
    ifwCmd += " -i ";
    // Binary
    std::set<cmCPackIFWPackage*>::iterator bit = BinaryPackages.begin();
    while(bit != BinaryPackages.end())
      {
      ifwCmd += (*bit)->Name + ",";
      ++bit;
      }
    // Depend
    DependenceMap::iterator it = DependentPackages.begin();
    ifwCmd += it->second.Name;
    ++it;
    while(it != DependentPackages.end())
      {
      ifwCmd += "," + it->second.Name;
      ++it;
      }
    }
  // TODO: set correct name for multipackages
  if (this->packageFileNames.size() > 0)
    {
    ifwCmd += " " + packageFileNames[0];
    }
  else
    {
    ifwCmd += " installer";
    }
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ifwCmd
                << std::endl);
  std::string output;
  int retVal = 1;
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- Generate package" << std::endl);
  bool res = cmSystemTools::RunSingleCommand(
    ifwCmd.c_str(), &output, &output,
    &retVal, 0, this->GeneratorVerbose, 0);
  if ( !res || retVal )
    {
    cmGeneratedFileStream ofs(ifwTmpFile.c_str());
    ofs << "# Run command: " << ifwCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running IFW command: "
                  << ifwCmd << std::endl
                  << "Please check " << ifwTmpFile << " for errors"
                  << std::endl);
    return 0;
    }
  }

  return 1;
}